

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::rpc_session::rpc_session
          (rpc_session *this,uint64_t id,asio_service_impl *_impl,io_service *io,
          ssl_context *ssl_ctx,bool _enable_ssl,ptr<msg_handler> *handler,ptr<logger> *logger,
          session_closed_callback *callback)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  string local_50;
  
  (this->super_enable_shared_from_this<nuraft::rpc_session>)._M_weak_this.
  super___weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<nuraft::rpc_session>)._M_weak_this.
  super___weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->session_id_ = id;
  this->impl_ = _impl;
  (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (handler->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (handler->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->handler_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,io,0);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
            ((stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *)
             &this->ssl_socket_,&this->socket_,ssl_ctx);
  this->ssl_enabled_ = _enable_ssl;
  *(undefined8 *)&this->flags_ = 0;
  *(undefined8 *)
   ((long)&(this->log_data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
   4) = 0;
  *(undefined4 *)
   ((long)&(this->log_data_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  buffer::alloc((buffer *)&this->header_,0x36);
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (logger->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::function
            (&this->callback_,callback);
  this->src_id_ = -1;
  this->is_leader_ = false;
  (this->cached_address_)._M_dataplus._M_p = (pointer)&(this->cached_address_).field_2;
  (this->cached_address_)._M_string_length = 0;
  (this->cached_address_).field_2._M_local_buf[0] = '\0';
  this->cached_port_ = 0;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar3 = (*peVar2->_vptr_logger[7])();
    if (5 < iVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_50,"asio rpc session created: %p",this);
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"rpc_session",0xf1,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

rpc_session( uint64_t id,
                 asio_service_impl* _impl,
                 asio::io_service& io,
                 ssl_context& ssl_ctx,
                 bool _enable_ssl,
                 ptr<msg_handler>& handler,
                 ptr<logger>& logger,
                 session_closed_callback& callback )
        : session_id_(id)
        , impl_(_impl)
        , handler_(handler)
        , socket_(io)
        , ssl_socket_(socket_, ssl_ctx)
        , ssl_enabled_(_enable_ssl)
        , flags_(0x0)
        , log_data_()
        , header_(buffer::alloc(RPC_REQ_HEADER_SIZE))
        , l_(logger)
        , callback_(callback)
        , src_id_(-1)
        , is_leader_(false)
        , cached_port_(0)
    {
        p_tr("asio rpc session created: %p", this);
    }